

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall
QtPrivate::QColorLuminancePicker::paintEvent(QColorLuminancePicker *this,QPaintEvent *param_1)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  QWidgetData *pQVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint __tmp;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  QPixmap *pQVar15;
  QPalette *pal;
  long lVar16;
  long in_FS_OFFSET;
  int iVar17;
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  QPainter p;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  QRect local_78;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (this->super_QWidget).data;
  local_78.x1.m_i = 0;
  local_78.y1.m_i = 3;
  uVar2 = (pQVar6->crect).x2;
  uVar4 = (pQVar6->crect).y2;
  uVar3 = (pQVar6->crect).x1;
  uVar5 = (pQVar6->crect).y1;
  iVar17 = uVar2 - uVar3;
  iVar19 = uVar4 - uVar5;
  local_78.x2.m_i = iVar17 + -5;
  local_78.y2.m_i = iVar19 + -3;
  iVar9 = iVar17 + -6;
  iVar12 = iVar19 + -7;
  if (this->pix != (QPixmap *)0x0) {
    iVar10 = QPixmap::height();
    if ((iVar10 == iVar12) && (iVar10 = QPixmap::width(), iVar10 == iVar9)) goto LAB_004d0960;
    if (this->pix != (QPixmap *)0x0) {
      (**(code **)(*(long *)this->pix + 8))();
    }
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_58,iVar9,iVar12,Format_RGB32);
  iVar10 = 0;
  lVar13 = QImage::scanLine((int)(QImage *)&local_58);
  if (8 < iVar19 + 1) {
    uVar1 = (long)iVar9 + 0x3fffffffffffffff;
    uVar14 = uVar1 & 0x3fffffffffffffff;
    auVar21._8_4_ = (int)uVar14;
    auVar21._0_8_ = uVar14;
    auVar21._12_4_ = (int)(uVar14 >> 0x20);
    auVar21 = auVar21 ^ _DAT_00660670;
    do {
      pQVar6 = (this->super_QWidget).data;
      auVar22 = QColor::fromHsv(this->hue,this->sat,
                                0xff - (iVar10 * 0xff) /
                                       (((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + -8),0xff
                               );
      local_68._0_8_ = auVar22._0_8_;
      local_68._8_4_ = auVar22._8_4_;
      local_68._12_2_ = auVar22._12_2_;
      uVar11 = QColor::rgb();
      auVar8 = _DAT_00660670;
      auVar7 = _DAT_00660660;
      auVar22 = _DAT_00660650;
      local_88 = auVar21._0_4_;
      iStack_84 = auVar21._4_4_;
      iStack_80 = auVar21._8_4_;
      iStack_7c = auVar21._12_4_;
      if (iVar9 != 0) {
        lVar16 = 0;
        do {
          auVar18._8_4_ = (int)lVar16;
          auVar18._0_8_ = lVar16;
          auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
          auVar20 = (auVar18 | auVar7) ^ auVar8;
          if ((bool)(~(iStack_84 < auVar20._4_4_ ||
                      local_88 < auVar20._0_4_ && auVar20._4_4_ == iStack_84) & 1)) {
            *(undefined4 *)(lVar13 + lVar16 * 4) = uVar11;
          }
          if (auVar20._12_4_ <= iStack_7c &&
              (auVar20._8_4_ <= iStack_80 || auVar20._12_4_ != iStack_7c)) {
            *(undefined4 *)(lVar13 + 4 + lVar16 * 4) = uVar11;
          }
          auVar18 = (auVar18 | auVar22) ^ auVar8;
          iVar19 = auVar18._4_4_;
          if (iVar19 <= iStack_84 && (iVar19 != iStack_84 || auVar18._0_4_ <= local_88)) {
            *(undefined4 *)(lVar13 + 8 + lVar16 * 4) = uVar11;
            *(undefined4 *)(lVar13 + 0xc + lVar16 * 4) = uVar11;
          }
          lVar16 = lVar16 + 4;
        } while ((uVar14 - ((uint)uVar1 & 3)) + 4 != lVar16);
      }
      iVar10 = iVar10 + 1;
      lVar13 = lVar13 + (long)iVar9 * 4;
    } while (iVar10 != iVar12);
  }
  pQVar15 = (QPixmap *)operator_new(0x18);
  QPixmap::fromImage(pQVar15,(QImage *)&local_58,0);
  this->pix = pQVar15;
  QImage::~QImage((QImage *)&local_58);
LAB_004d0960:
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_68,&(this->super_QWidget).super_QPaintDevice);
  local_58 = (undefined1 *)0x3ff0000000000000;
  uStack_50 = (undefined1 *)0x4010000000000000;
  QPainter::drawPixmap((QPointF *)local_68,(QPixmap *)&local_58);
  pal = QWidget::palette(&this->super_QWidget);
  qDrawShadePanel((QPainter *)local_68,&local_78,pal,true,1,(QBrush *)0x0);
  QPalette::brush((ColorGroup)pal,Dark);
  QPainter::setPen((QColor *)local_68);
  QPalette::brush((ColorGroup)pal,Dark);
  QPainter::setBrush((QBrush *)local_68);
  pQVar6 = (this->super_QWidget).data;
  local_58 = (undefined1 *)(double)(iVar17 + -4);
  local_40 = (double)(((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + 1);
  uStack_50 = (undefined1 *)0x0;
  local_48 = (undefined1 *)0x4014000000000000;
  QPainter::eraseRect((QRectF *)local_68);
  pQVar6 = (this->super_QWidget).data;
  iVar9 = (0xff - this->val) * (((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + -8);
  iVar12 = iVar9 >> 0x1f;
  iVar9 = iVar9 / 0xff + iVar12;
  iVar12 = -iVar12;
  local_58 = (undefined1 *)CONCAT44(iVar9 + iVar12 + 4,iVar17 + -4);
  uStack_50 = (undefined1 *)CONCAT44(iVar9 + 9 + iVar12,iVar17 + 1);
  local_48 = (undefined1 *)CONCAT44(iVar9 + -1 + iVar12,iVar17 + 1);
  QPainter::drawPolygon((QPoint *)local_68,(int)&local_58,3);
  QPainter::~QPainter((QPainter *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorLuminancePicker::paintEvent(QPaintEvent *)
{
    int w = width() - 5;

    QRect r(0, foff, w, height() - 2*foff);
    int wi = r.width() - 2;
    int hi = r.height() - 2;
    if (!pix || pix->height() != hi || pix->width() != wi) {
        delete pix;
        QImage img(wi, hi, QImage::Format_RGB32);
        int y;
        uint *pixel = (uint *) img.scanLine(0);
        for (y = 0; y < hi; y++) {
            uint *end = pixel + wi;
            std::fill(pixel, end, QColor::fromHsv(hue, sat, y2val(y + coff)).rgb());
            pixel = end;
        }
        pix = new QPixmap(QPixmap::fromImage(img));
    }
    QPainter p(this);
    p.drawPixmap(1, coff, *pix);
    const QPalette &g = palette();
    qDrawShadePanel(&p, r, g, true);
    p.setPen(g.windowText().color());
    p.setBrush(g.windowText());
    p.eraseRect(w, 0, 5, height());
    const int y = val2y(val);
    const std::array<QPoint, 3> points = {QPoint(w, y), QPoint(w + 5, y + 5), QPoint(w + 5, y - 5)};
    p.drawPolygon(points.data(), static_cast<int>(points.size()));
}